

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

bool google::FindSymbol(uint64_t pc,int fd,char *out,size_t out_size,uint64_t symbol_offset,
                       Elf64_Shdr *strtab,Elf64_Shdr *symtab)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ssize_t sVar7;
  void *pvVar8;
  byte bVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  Elf64_Sym buf [32];
  uint local_338;
  short local_332;
  long alStack_330 [96];
  
  if (symtab == (Elf64_Shdr *)0x0) {
LAB_00120a45:
    bVar9 = 0;
  }
  else {
    uVar3 = symtab->sh_size / symtab->sh_entsize;
    uVar10 = symtab->sh_size % symtab->sh_entsize;
    uVar12 = 0;
    do {
      uVar4 = (ulong)uVar12;
      uVar13 = uVar3 - uVar4;
      if (uVar3 < uVar4 || uVar13 == 0) goto LAB_00120a45;
      uVar10 = uVar10 & 0xffffffff;
      if (0x1f < uVar13) {
        uVar13 = 0x20;
      }
      uVar4 = ReadFromOffset(fd,&local_338,(ulong)(uint)((int)uVar13 * 8) * 3,
                             symtab->sh_entsize * uVar4 + symtab->sh_offset);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar4;
      uVar5 = SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),0);
      if ((0xaaaaaaaaaaaaaaa < (uVar5 >> 3 | uVar5 << 0x3d)) ||
         (uVar5 = uVar4 / 0x18, uVar13 < uVar5)) {
        abort();
      }
      bVar14 = 0x17 < uVar4;
      if (bVar14) {
        uVar13 = 0;
        uVar4 = 1;
        do {
          bVar1 = true;
          if ((alStack_330[uVar13 * 3] != 0) &&
             (uVar6 = alStack_330[uVar13 * 3] + symbol_offset, uVar6 <= pc)) {
            if (((&local_332)[uVar13 * 0xc] != 0) && (pc < uVar6 + alStack_330[uVar13 * 3 + 1])) {
              sVar7 = ReadFromOffset(fd,out,out_size,
                                     (ulong)(&local_338)[uVar13 * 6] + strtab->sh_offset);
              if ((sVar7 < 1) || (pvVar8 = memchr(out,0,out_size), pvVar8 == (void *)0x0)) {
                memset(out,0,out_size);
                uVar10 = 0;
              }
              else {
                uVar10 = 1;
              }
              bVar1 = false;
            }
          }
          if (!bVar1) break;
          bVar14 = uVar4 < uVar5;
          bVar1 = uVar4 < uVar5;
          uVar13 = uVar4;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (bVar1);
      }
      bVar9 = (byte)uVar10;
      iVar11 = (int)uVar5;
      if (bVar14) {
        iVar11 = 0;
      }
      uVar12 = iVar11 + uVar12;
    } while (!bVar14);
  }
  return (bool)(bVar9 & 1);
}

Assistant:

static ATTRIBUTE_NOINLINE bool FindSymbol(uint64_t pc, const int fd, char* out,
                                          size_t out_size,
                                          uint64_t symbol_offset,
                                          const ElfW(Shdr) * strtab,
                                          const ElfW(Shdr) * symtab) {
  if (symtab == nullptr) {
    return false;
  }
  const size_t num_symbols = symtab->sh_size / symtab->sh_entsize;
  for (unsigned i = 0; i < num_symbols;) {
    size_t offset = symtab->sh_offset + i * symtab->sh_entsize;

    // If we are reading Elf64_Sym's, we want to limit this array to
    // 32 elements (to keep stack consumption low), otherwise we can
    // have a 64 element Elf32_Sym array.
#    if defined(__WORDSIZE) && __WORDSIZE == 64
    const size_t NUM_SYMBOLS = 32U;
#    else
    const size_t NUM_SYMBOLS = 64U;
#    endif

    // Read at most NUM_SYMBOLS symbols at once to save read() calls.
    ElfW(Sym) buf[NUM_SYMBOLS];
    size_t num_symbols_to_read = std::min(NUM_SYMBOLS, num_symbols - i);
    const ssize_t len =
        ReadFromOffset(fd, &buf, sizeof(buf[0]) * num_symbols_to_read, offset);
    GLOG_SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_symbols_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    GLOG_SAFE_ASSERT(num_symbols_in_buf <= num_symbols_to_read);
    for (unsigned j = 0; j < num_symbols_in_buf; ++j) {
      const ElfW(Sym)& symbol = buf[j];
      uint64_t start_address = symbol.st_value;
      start_address += symbol_offset;
      uint64_t end_address = start_address + symbol.st_size;
      if (symbol.st_value != 0 &&  // Skip null value symbols.
          symbol.st_shndx != 0 &&  // Skip undefined symbols.
          start_address <= pc && pc < end_address) {
        ssize_t len1 = ReadFromOffset(fd, out, out_size,
                                      strtab->sh_offset + symbol.st_name);
        if (len1 <= 0 || memchr(out, '\0', out_size) == nullptr) {
          memset(out, 0, out_size);
          return false;
        }
        return true;  // Obtained the symbol name.
      }
    }
    i += num_symbols_in_buf;
  }
  return false;
}